

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_loop_restoration_save_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int after_cdef)

{
  uint8_t uVar1;
  int row;
  int iVar2;
  uint use_highbd;
  int iVar3;
  ulong uVar4;
  RestorationStripeBoundaries *boundaries;
  int row_00;
  int plane;
  int iVar5;
  int stripe;
  bool bVar6;
  bool bVar7;
  int local_44;
  RestorationInfo *local_40;
  int plane_w;
  
  uVar1 = cm->seq_params->monochrome;
  use_highbd = (uint)cm->seq_params->use_highbitdepth;
  local_40 = cm->rst_info;
  uVar4 = 0;
  do {
    bVar7 = false;
    if (uVar4 != 0) {
      bVar7 = cm->seq_params->subsampling_y != 0;
    }
    av1_get_upsampled_plane_size(cm,(uint)(uVar4 != 0),&plane_w,&local_44);
    iVar2 = local_44;
    iVar3 = (int)(((uint)(1 << bVar7) >> 1) + cm->height) >> bVar7;
    if (0 < local_44) {
      boundaries = &local_40[uVar4].boundaries;
      iVar5 = -(8U >> bVar7);
      row_00 = 0;
      bVar6 = true;
      stripe = 0;
      do {
        iVar5 = iVar5 + (0x40U >> bVar7);
        row = iVar2;
        if (iVar5 < iVar2) {
          row = iVar5;
        }
        plane = (int)uVar4;
        if (after_cdef == 0) {
          if (stripe != 0) {
            save_deblock_boundary_lines(frame,cm,plane,row_00 + -2,stripe,use_highbd,1,boundaries);
          }
          if (row < iVar3) {
            save_deblock_boundary_lines(frame,cm,plane,row,stripe,use_highbd,0,boundaries);
          }
        }
        else {
          if (stripe == 0) {
            save_cdef_boundary_lines(frame,cm,plane,row_00,0,use_highbd,1,boundaries);
          }
          if (iVar3 <= row) {
            save_cdef_boundary_lines(frame,cm,plane,row + -1,stripe,use_highbd,0,boundaries);
          }
        }
        if (!bVar6) break;
        stripe = stripe + 1;
        row_00 = stripe * (0x40U >> bVar7) - (8U >> bVar7);
        bVar6 = iVar5 < iVar2;
      } while (iVar5 < iVar2);
    }
    if ((uVar1 != '\0') || (bVar7 = 1 < uVar4, uVar4 = uVar4 + 1, bVar7)) {
      return;
    }
  } while( true );
}

Assistant:

void av1_loop_restoration_save_boundary_lines(const YV12_BUFFER_CONFIG *frame,
                                              AV1_COMMON *cm, int after_cdef) {
  const int num_planes = av1_num_planes(cm);
  const int use_highbd = cm->seq_params->use_highbitdepth;
  for (int p = 0; p < num_planes; ++p) {
    save_boundary_lines(frame, use_highbd, p, cm, after_cdef);
  }
}